

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O1

void __thiscall adjMaxtrix<char>::~adjMaxtrix(adjMaxtrix<char> *this)

{
  pointer pcVar1;
  ulong uVar2;
  
  pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar1) {
    uVar2 = 0;
    do {
      if (this->edge[uVar2] != (int *)0x0) {
        operator_delete__(this->edge[uVar2]);
      }
      uVar2 = uVar2 + 1;
      pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1));
  }
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

adjMaxtrix<dataType>::~adjMaxtrix()
{
	//撤销矩阵
	for (int i = 0; i < vexs.size(); i++)
		delete[] edge[i];
}